

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

_Bool GPU_SaveSurface_RW(SDL_Surface *surface,SDL_RWops *rwops,_Bool free_rwops,
                        GPU_FileFormatEnum format)

{
  void *data_00;
  int iVar1;
  uchar *data;
  _Bool result;
  GPU_FileFormatEnum format_local;
  _Bool free_rwops_local;
  SDL_RWops *rwops_local;
  SDL_Surface *surface_local;
  
  if ((((surface == (SDL_Surface *)0x0) || (rwops == (SDL_RWops *)0x0)) || (surface->w < 1)) ||
     (surface->h < 1)) {
    surface_local._7_1_ = false;
  }
  else {
    data_00 = surface->pixels;
    if (format == GPU_FILE_AUTO) {
      GPU_PushErrorCode("GPU_SaveSurface_RW",GPU_ERROR_DATA_ERROR,
                        "Invalid output file format (GPU_FILE_AUTO)");
      surface_local._7_1_ = false;
    }
    else {
      if (format == GPU_FILE_PNG) {
        iVar1 = stbi_write_png_to_func
                          (write_func,rwops,surface->w,surface->h,
                           (uint)surface->format->BytesPerPixel,data_00,surface->pitch);
        surface_local._7_1_ = 0 < iVar1;
      }
      else if (format == GPU_FILE_BMP) {
        iVar1 = stbi_write_bmp_to_func
                          (write_func,rwops,surface->w,surface->h,
                           (uint)surface->format->BytesPerPixel,data_00);
        surface_local._7_1_ = 0 < iVar1;
      }
      else if (format == GPU_FILE_TGA) {
        iVar1 = stbi_write_tga_to_func
                          (write_func,rwops,surface->w,surface->h,
                           (uint)surface->format->BytesPerPixel,data_00);
        surface_local._7_1_ = 0 < iVar1;
      }
      else {
        GPU_PushErrorCode("GPU_SaveSurface_RW",GPU_ERROR_DATA_ERROR,"Unsupported output file format"
                         );
        surface_local._7_1_ = false;
      }
      if ((surface_local._7_1_) && (free_rwops)) {
        SDL_RWclose(rwops);
      }
    }
  }
  return surface_local._7_1_;
}

Assistant:

GPU_bool GPU_SaveSurface_RW(SDL_Surface* surface, SDL_RWops* rwops, GPU_bool free_rwops, GPU_FileFormatEnum format)
{
    GPU_bool result;
    unsigned char* data;

    if(surface == NULL || rwops == NULL ||
            surface->w < 1 || surface->h < 1)
    {
        return GPU_FALSE;
    }

    data = surface->pixels;

    if(format == GPU_FILE_AUTO)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_DATA_ERROR, "Invalid output file format (GPU_FILE_AUTO)");
        return GPU_FALSE;
    }

    // FIXME: The limitations here are not communicated clearly.  BMP and TGA won't support arbitrary row length/pitch.
    switch(format)
    {
    case GPU_FILE_PNG:
        result = (stbi_write_png_to_func(write_func, rwops, surface->w, surface->h, surface->format->BytesPerPixel, (const unsigned char *const)data, surface->pitch) > 0);
        break;
    case GPU_FILE_BMP:
        result = (stbi_write_bmp_to_func(write_func, rwops, surface->w, surface->h, surface->format->BytesPerPixel, (const unsigned char *const)data) > 0);
        break;
    case GPU_FILE_TGA:
        result = (stbi_write_tga_to_func(write_func, rwops, surface->w, surface->h, surface->format->BytesPerPixel, (const unsigned char *const)data) > 0);
        break;
    default:
        GPU_PushErrorCode(__func__, GPU_ERROR_DATA_ERROR, "Unsupported output file format");
        result = GPU_FALSE;
        break;
    }

    if(result && free_rwops)
        SDL_RWclose(rwops);
    return result;
}